

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicCopyTexSubImageCubeCase::createTexture
          (BasicCopyTexSubImageCubeCase *this)

{
  deUint32 target;
  deUint32 format;
  deUint32 type;
  float width;
  int iVar1;
  deUint32 dVar2;
  int width_00;
  int height;
  int xoffset;
  int yoffset;
  int iVar3;
  int iVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  PixelFormat *pPVar6;
  char *str;
  Context *pCVar7;
  NotSupportedError *this_00;
  void *data_00;
  bool bVar8;
  bool bVar9;
  bool local_2fd;
  int y;
  int x;
  int yo;
  int xo;
  int h;
  int w;
  int face_1;
  int levelSize_1;
  int ndx_1;
  Vector<float,_3> local_2cc;
  Vector<float,_4> local_2c0;
  Vector<float,_4> local_2b0;
  PixelBufferAccess local_2a0;
  PixelBufferAccess local_278;
  int local_24c;
  int cellSize;
  Vector<float,_4> local_238;
  undefined1 local_228 [8];
  Vec4 colorB;
  Vector<float,_4> local_208;
  undefined1 local_1f8 [8];
  Vec4 colorA;
  int face;
  int levelSize;
  int ndx;
  deUint32 shaderID;
  GradientShader shader;
  undefined1 local_70 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  bool texHasAlpha;
  bool texHasRGB;
  TextureFormat fmt;
  bool targetHasAlpha;
  bool targetHasRGB;
  RenderTarget *renderTarget;
  BasicCopyTexSubImageCubeCase *this_local;
  
  pRVar5 = Context::getRenderContext
                     ((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                      m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[4])();
  register0x00000000 = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  pPVar6 = tcu::RenderTarget::getPixelFormat(register0x00000000);
  local_2fd = false;
  if (0 < pPVar6->redBits) {
    pPVar6 = tcu::RenderTarget::getPixelFormat(stack0xffffffffffffffe0);
    local_2fd = false;
    if (0 < pPVar6->greenBits) {
      pPVar6 = tcu::RenderTarget::getPixelFormat(stack0xffffffffffffffe0);
      local_2fd = 0 < pPVar6->blueBits;
    }
  }
  fmt.order._3_1_ = local_2fd;
  pPVar6 = tcu::RenderTarget::getPixelFormat(stack0xffffffffffffffe0);
  fmt.order._2_1_ = 0 < pPVar6->alphaBits;
  _tex = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  bVar8 = tex == 1;
  bVar9 = true;
  if ((tex != 8) && (bVar9 = true, tex != 4)) {
    bVar9 = tex == 1;
  }
  data.m_data.m_cap._4_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)local_70,dVar2);
  FboTestUtil::GradientShader::GradientShader((GradientShader *)&ndx,TYPE_FLOAT_VEC4);
  pCVar7 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper)
  ;
  dVar2 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&ndx);
  if (((bVar8) || ((fmt.order._3_1_ & 1) != R >> 0x18)) &&
     ((!bVar9 || ((fmt.order._2_1_ & 1) != R >> 0x10)))) {
    sglr::ContextWrapper::glGenTextures
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
               (deUint32 *)((long)&data.m_data.m_cap + 4));
    sglr::ContextWrapper::glBindTexture
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
               data.m_data.m_cap._4_4_);
    sglr::ContextWrapper::glPixelStorei
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1
              );
    for (face = 0; face < (this->super_TextureCubeSpecCase).m_numLevels; face = face + 1) {
      colorA.m_data[3] =
           (float)de::max<int>(1,(this->super_TextureCubeSpecCase).m_size >> ((byte)face & 0x1f));
      tcu::TextureLevel::setSize
                ((TextureLevel *)&rnd.m_rnd.z,(int)colorA.m_data[3],(int)colorA.m_data[3],1);
      for (colorA.m_data[2] = 0.0; (int)colorA.m_data[2] < 6;
          colorA.m_data[2] = (float)((int)colorA.m_data[2] + 1)) {
        tcu::Vector<float,_4>::Vector(&local_208,0.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0);
        randomVector<4>((Functional *)local_1f8,(Random *)local_70,&local_208,
                        (Vector<float,_4> *)(colorB.m_data + 2));
        tcu::Vector<float,_4>::Vector(&local_238,0.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffdb8,1.0);
        randomVector<4>((Functional *)local_228,(Random *)local_70,&local_238,
                        (Vector<float,_4> *)&stack0xfffffffffffffdb8);
        local_24c = de::Random::getInt((Random *)local_70,2,0x10);
        tcu::TextureLevel::getAccess(&local_278,(TextureLevel *)&rnd.m_rnd.z);
        tcu::fillWithGrid(&local_278,local_24c,(Vec4 *)local_1f8,(Vec4 *)local_228);
        width = colorA.m_data[3];
        target = *(deUint32 *)(s_cubeMapFaces + (long)(int)colorA.m_data[2] * 4);
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_2a0,(TextureLevel *)&rnd.m_rnd.z);
        data_00 = tcu::PixelBufferAccess::getDataPtr(&local_2a0);
        sglr::ContextWrapper::glTexImage2D
                  (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,
                   target,face,format,(int)width,(int)width,0,format,type,data_00);
      }
    }
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.
                         super_ContextWrapper);
    tcu::Vector<float,_4>::Vector(&local_2b0,0.0);
    tcu::Vector<float,_4>::Vector(&local_2c0,1.0);
    FboTestUtil::GradientShader::setGradient
              ((GradientShader *)&ndx,pCVar7,dVar2,&local_2b0,&local_2c0);
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.
                         super_ContextWrapper);
    tcu::Vector<float,_3>::Vector(&local_2cc,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&levelSize_1,1.0,1.0,0.0);
    sglr::drawQuad(pCVar7,dVar2,&local_2cc,(Vec3 *)&levelSize_1);
    for (face_1 = 0; face_1 < (this->super_TextureCubeSpecCase).m_numLevels; face_1 = face_1 + 1) {
      iVar1 = de::max<int>(1,(this->super_TextureCubeSpecCase).m_size >> ((byte)face_1 & 0x1f));
      for (h = 0; h < 6; h = h + 1) {
        width_00 = de::Random::getInt((Random *)local_70,1,iVar1);
        height = de::Random::getInt((Random *)local_70,1,iVar1);
        xoffset = de::Random::getInt((Random *)local_70,0,iVar1 - width_00);
        yoffset = de::Random::getInt((Random *)local_70,0,iVar1 - height);
        iVar3 = sglr::ContextWrapper::getWidth
                          (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.
                            super_ContextWrapper);
        iVar3 = de::Random::getInt((Random *)local_70,0,iVar3 - width_00);
        iVar4 = sglr::ContextWrapper::getHeight
                          (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.
                            super_ContextWrapper);
        iVar4 = de::Random::getInt((Random *)local_70,0,iVar4 - height);
        sglr::ContextWrapper::glCopyTexSubImage2D
                  (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,
                   *(deUint32 *)(s_cubeMapFaces + (long)h * 4),face_1,xoffset,yoffset,iVar3,iVar4,
                   width_00,height);
      }
    }
    FboTestUtil::GradientShader::~GradientShader((GradientShader *)&ndx);
    de::Random::~Random((Random *)local_70);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x80f);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= glu::mapGLTransferFormat(m_format, m_dataType);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			data.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelSize, levelSize, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelSize);
				int		h			= rnd.getInt(1, levelSize);
				int		xo			= rnd.getInt(0, levelSize-w);
				int		yo			= rnd.getInt(0, levelSize-h);

				int		x			= rnd.getInt(0, getWidth() - w);
				int		y			= rnd.getInt(0, getHeight() - h);

				glCopyTexSubImage2D(s_cubeMapFaces[face], ndx, xo, yo, x, y, w, h);
			}
		}
	}